

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O2

w3Tag __thiscall w3Module::read_blocktype(w3Module *this,uint8_t **cursor)

{
  w3Tag wVar1;
  string local_30;
  
  wVar1 = read_byte(this,cursor);
  if ((0x3f < wVar1 - 0x40) || ((0xf000000000000001U >> ((ulong)(wVar1 - 0x40) & 0x3f) & 1) == 0)) {
    StringFormat_abi_cxx11_(&local_30,"invalid BlockType:%X");
    ThrowString(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return wVar1;
}

Assistant:

w3Tag w3Module::read_blocktype(uint8_t** cursor)
{
    const uint32_t block_type = read_byte (cursor);
    switch (block_type)
    {
    default:
        ThrowString (StringFormat ("invalid BlockType:%X", block_type));
        break;
    case Tag_i32:
    case Tag_i64:
    case Tag_f32:
    case Tag_f64:
    case Tag_empty:
        break;
    }
    return (w3Tag)block_type;
}